

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.hpp
# Opt level: O0

uint32_t rest_rpc::MD5::MD5CE::StringLength(char *string)

{
  char *end;
  char *string_local;
  
  for (end = string; *end != '\0'; end = end + 1) {
  }
  return (int)end - (int)string;
}

Assistant:

static uint32_t StringLength(const char *string) {
    const char *end = string;
    while (*end != 0)
      ++end;
    // Double check that the precision losing conversion is safe.
    //    DCHECK(end >= string);
    //    DCHECK(static_cast<std::ptrdiff_t>(static_cast<uint32_t>(end -
    //    string)) ==
    //           (end - string));
    return static_cast<uint32_t>(end - string);
  }